

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver.cpp
# Opt level: O0

void __thiscall
QSslServerPrivate::initializeHandshakeProcess(QSslServerPrivate *this,QSslSocket *socket)

{
  element_type *peVar1;
  QSslServerPrivate *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  Connection destroyed;
  Connection readyRead;
  QSslServer *q;
  QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *args_2;
  anon_class_16_2_5362ef6e_for_o *args_1;
  Connection *in_stack_ffffffffffffff30;
  Connection *this_00;
  QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *in_stack_ffffffffffffff40;
  anon_class_8_1_8991fb9c_for_o *in_stack_ffffffffffffff60;
  code *context;
  Object *sender;
  offset_in_QObject_to_subr in_stack_ffffffffffffff90;
  Connection local_68;
  anon_class_16_2_5362ef6e_for_o local_60;
  ConnectionType in_stack_ffffffffffffffb0;
  Connection local_28 [2];
  Connection local_18;
  QSslServer *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = q_func(in_RDI);
  local_18.d_ptr = (void *)0xaaaaaaaaaaaaaaaa;
  context = QIODevice::readyRead;
  sender = (Object *)0x0;
  QObject::
  connect<void(QIODevice::*)(),QSslServerPrivate::initializeHandshakeProcess(QSslSocket*)::__0>
            ((Object *)0x0,in_stack_ffffffffffffff90,(ContextType *)QIODevice::readyRead,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffffb0);
  local_28[0].d_ptr = (void *)0xaaaaaaaaaaaaaaaa;
  QObject::
  connect<void(QObject::*)(QObject*),QSslServerPrivate::initializeHandshakeProcess(QSslSocket*)::__1>
            (sender,in_stack_ffffffffffffff90,(ContextType *)context,
             (anon_class_8_1_8991fb9c_for_o *)0x0,in_stack_ffffffffffffffb0);
  args_2 = &in_RDI->socketData;
  args_1 = &local_60;
  std::make_shared<QTimer>();
  QHash<unsigned_long_long,QSslServerPrivate::SocketData>::
  emplace<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
            (in_stack_ffffffffffffff40,(unsigned_long_long *)in_RDI,in_stack_ffffffffffffff30,
             (Connection *)args_1,(shared_ptr<QTimer> *)args_2);
  std::shared_ptr<QTimer>::~shared_ptr((shared_ptr<QTimer> *)0x3b1275);
  QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::iterator::operator->
            ((iterator *)0x3b1287);
  peVar1 = std::__shared_ptr_access<QTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<QTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x3b1293);
  QTimer::setSingleShot(SUB81(peVar1,0));
  QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::iterator::operator->
            ((iterator *)0x3b12aa);
  std::__shared_ptr_access<QTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x3b12b6);
  this_00 = &local_68;
  QTimer::
  callOnTimeout<QSslServer*const&,QSslServerPrivate::initializeHandshakeProcess(QSslSocket*)::__2>
            ((QTimer *)in_RDI,(QSslServer **)this_00,args_1);
  QMetaObject::Connection::~Connection(this_00);
  QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::iterator::operator->
            ((iterator *)0x3b1309);
  peVar1 = std::__shared_ptr_access<QTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<QTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x3b1315);
  QTimer::setInterval((int)peVar1);
  QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::iterator::operator->
            ((iterator *)0x3b1332);
  std::__shared_ptr_access<QTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x3b133e);
  QTimer::start();
  QMetaObject::Connection::~Connection(local_28);
  QMetaObject::Connection::~Connection(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslServerPrivate::initializeHandshakeProcess(QSslSocket *socket)
{
    Q_Q(QSslServer);
    QMetaObject::Connection readyRead = QObject::connect(
            socket, &QSslSocket::readyRead, q, [this]() { checkClientHelloAndContinue(); });

    QMetaObject::Connection destroyed =
            QObject::connect(socket, &QSslSocket::destroyed, q, [this](QObject *obj) {
                // This cast is not safe to use since the socket is inside the
                // QObject dtor, but we only use the pointer value!
                removeSocketData(quintptr(obj));
            });
    auto it = socketData.emplace(quintptr(socket), readyRead, destroyed, std::make_shared<QTimer>());
    it->timeoutTimer->setSingleShot(true);
    it->timeoutTimer->callOnTimeout(q, [this, socket]() { handleHandshakeTimedOut(socket); });
    it->timeoutTimer->setInterval(handshakeTimeout);
    it->timeoutTimer->start();
}